

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19f5211::ResizeRealtimeTest::ResizeRealtimeTest(ResizeRealtimeTest *this)

{
  ParamType *pPVar1;
  
  testing::Test::Test((Test *)this);
  (this->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_0106d2f8;
  (this->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__CodecTestWith3Params_0106d338;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  (this->super_EncoderTest).codec_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  (this->super_EncoderTest).abort_ = false;
  (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p =
       (pointer)&(this->super_EncoderTest).stats_.buffer_.field_2;
  (this->super_EncoderTest).stats_.buffer_._M_string_length = 0;
  (this->super_EncoderTest).stats_.buffer_.field_2._M_local_buf[0] = '\0';
  (this->super_EncoderTest).init_flags_ = 0;
  (this->super_EncoderTest).frame_flags_ = 0;
  (this->super_EncoderTest).mode_ = kRealTime;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  (this->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__ResizeRealtimeTest_0108b590;
  (this->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__ResizeRealtimeTest_0108b5e8;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__ResizeRealtimeTest_0108b608;
  (this->frame_info_list_).
  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frame_info_list_).
  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frame_info_list_).
  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  this->num_threads_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
  this->set_scale_mode_ = false;
  this->set_scale_mode2_ = false;
  this->set_scale_mode3_ = false;
  this->is_screen_ = false;
  return;
}

Assistant:

ResizeRealtimeTest()
      : EncoderTest(GET_PARAM(0)), num_threads_(GET_PARAM(3)),
        set_scale_mode_(false), set_scale_mode2_(false),
        set_scale_mode3_(false), is_screen_(false) {}